

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SN_BLOCK::SortBlockHelper(ON_SN_BLOCK *this)

{
  uint uVar1;
  anon_union_8_5_72d3814f_for_m_u aVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ON__UINT64 OVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  ON_UUID *pOVar11;
  ON__UINT32 OVar12;
  ON__UINT32 OVar13;
  ON__UINT8 OVar14;
  ON__UINT8 OVar15;
  ON__UINT8 OVar16;
  ON__UINT8 OVar17;
  ON__UINT32 OVar18;
  unsigned_short uVar19;
  unsigned_short uVar20;
  ON__UINT32 OVar21;
  ON__UINT32 OVar22;
  ON__UINT8 OVar23;
  ON__UINT8 OVar24;
  ON__UINT8 OVar25;
  ON__UINT8 OVar26;
  ON__UINT32 OVar27;
  uint uVar28;
  unsigned_short uVar29;
  unsigned_short uVar30;
  ON__UINT64 OVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  SN_ELEMENT *pSVar35;
  SN_ELEMENT *pSVar36;
  SN_ELEMENT *pSVar37;
  SN_ELEMENT *pSVar38;
  ulong uVar39;
  SN_ELEMENT *pSVar40;
  SN_ELEMENT *pSVar41;
  SN_ELEMENT *pSVar42;
  SN_ELEMENT *histk [62];
  SN_ELEMENT *lostk [62];
  ulong local_3f8 [62];
  undefined8 auStack_208 [49];
  SN_ELEMENT tmp;
  
  uVar1 = this->m_count;
  if (1 < (ulong)uVar1) {
    uVar33 = 0;
    pSVar37 = this->m_sn + ((ulong)uVar1 - 1);
    pSVar38 = this->m_sn;
LAB_004d49bf:
    while( true ) {
      iVar32 = (int)uVar33;
      uVar39 = ((long)pSVar37 - (long)pSVar38 >> 3) * 0x6db6db6db6db6db7 + 1;
      if (uVar39 < 9) break;
      uVar39 = uVar39 >> 1;
      pSVar40 = pSVar38 + uVar39;
      if (pSVar38[uVar39].m_sn < pSVar38->m_sn) {
        aVar2 = (pSVar38->m_value).m_u;
        uVar28 = (pSVar38->m_id).Data1;
        uVar29 = (pSVar38->m_id).Data2;
        uVar30 = (pSVar38->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar38->m_id).Data4;
        OVar31 = pSVar38->m_sn;
        OVar23 = pSVar38->m_sn_active;
        OVar24 = pSVar38->m_id_active;
        OVar25 = pSVar38->m_reserved1;
        OVar26 = pSVar38->m_reserved2;
        OVar27 = pSVar38->m_id_crc32;
        pSVar41 = pSVar38->m_next;
        OVar21 = (pSVar38->m_value).m_u_type;
        OVar22 = (pSVar38->m_value).m_u32;
        (pSVar38->m_value).m_u = (pSVar40->m_value).m_u;
        uVar1 = (pSVar40->m_id).Data1;
        uVar19 = (pSVar40->m_id).Data2;
        uVar20 = (pSVar40->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar40->m_id).Data4;
        OVar5 = pSVar40->m_sn;
        OVar14 = pSVar40->m_sn_active;
        OVar15 = pSVar40->m_id_active;
        OVar16 = pSVar40->m_reserved1;
        OVar17 = pSVar40->m_reserved2;
        OVar18 = pSVar40->m_id_crc32;
        OVar12 = (pSVar40->m_value).m_u_type;
        OVar13 = (pSVar40->m_value).m_u32;
        pSVar38->m_next = pSVar40->m_next;
        (pSVar38->m_value).m_u_type = OVar12;
        (pSVar38->m_value).m_u32 = OVar13;
        pSVar38->m_sn = OVar5;
        pSVar38->m_sn_active = OVar14;
        pSVar38->m_id_active = OVar15;
        pSVar38->m_reserved1 = OVar16;
        pSVar38->m_reserved2 = OVar17;
        pSVar38->m_id_crc32 = OVar18;
        (pSVar38->m_id).Data1 = uVar1;
        (pSVar38->m_id).Data2 = uVar19;
        (pSVar38->m_id).Data3 = uVar20;
        *(undefined8 *)(pSVar38->m_id).Data4 = uVar4;
        (pSVar40->m_value).m_u = aVar2;
        pSVar40->m_next = pSVar41;
        (pSVar40->m_value).m_u_type = OVar21;
        (pSVar40->m_value).m_u32 = OVar22;
        pSVar40->m_sn = OVar31;
        pSVar40->m_sn_active = OVar23;
        pSVar40->m_id_active = OVar24;
        pSVar40->m_reserved1 = OVar25;
        pSVar40->m_reserved2 = OVar26;
        pSVar40->m_id_crc32 = OVar27;
        (pSVar40->m_id).Data1 = uVar28;
        (pSVar40->m_id).Data2 = uVar29;
        (pSVar40->m_id).Data3 = uVar30;
        *(undefined8 *)(pSVar40->m_id).Data4 = uVar3;
      }
      if (pSVar37->m_sn < pSVar38->m_sn) {
        aVar2 = (pSVar38->m_value).m_u;
        uVar28 = (pSVar38->m_id).Data1;
        uVar29 = (pSVar38->m_id).Data2;
        uVar30 = (pSVar38->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar38->m_id).Data4;
        OVar31 = pSVar38->m_sn;
        OVar23 = pSVar38->m_sn_active;
        OVar24 = pSVar38->m_id_active;
        OVar25 = pSVar38->m_reserved1;
        OVar26 = pSVar38->m_reserved2;
        OVar27 = pSVar38->m_id_crc32;
        pSVar41 = pSVar38->m_next;
        OVar21 = (pSVar38->m_value).m_u_type;
        OVar22 = (pSVar38->m_value).m_u32;
        (pSVar38->m_value).m_u = (pSVar37->m_value).m_u;
        uVar1 = (pSVar37->m_id).Data1;
        uVar19 = (pSVar37->m_id).Data2;
        uVar20 = (pSVar37->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar37->m_id).Data4;
        OVar5 = pSVar37->m_sn;
        OVar14 = pSVar37->m_sn_active;
        OVar15 = pSVar37->m_id_active;
        OVar16 = pSVar37->m_reserved1;
        OVar17 = pSVar37->m_reserved2;
        OVar18 = pSVar37->m_id_crc32;
        OVar12 = (pSVar37->m_value).m_u_type;
        OVar13 = (pSVar37->m_value).m_u32;
        pSVar38->m_next = pSVar37->m_next;
        (pSVar38->m_value).m_u_type = OVar12;
        (pSVar38->m_value).m_u32 = OVar13;
        pSVar38->m_sn = OVar5;
        pSVar38->m_sn_active = OVar14;
        pSVar38->m_id_active = OVar15;
        pSVar38->m_reserved1 = OVar16;
        pSVar38->m_reserved2 = OVar17;
        pSVar38->m_id_crc32 = OVar18;
        (pSVar38->m_id).Data1 = uVar1;
        (pSVar38->m_id).Data2 = uVar19;
        (pSVar38->m_id).Data3 = uVar20;
        *(undefined8 *)(pSVar38->m_id).Data4 = uVar4;
        (pSVar37->m_value).m_u = aVar2;
        pSVar37->m_next = pSVar41;
        (pSVar37->m_value).m_u_type = OVar21;
        (pSVar37->m_value).m_u32 = OVar22;
        pSVar37->m_sn = OVar31;
        pSVar37->m_sn_active = OVar23;
        pSVar37->m_id_active = OVar24;
        pSVar37->m_reserved1 = OVar25;
        pSVar37->m_reserved2 = OVar26;
        pSVar37->m_id_crc32 = OVar27;
        (pSVar37->m_id).Data1 = uVar28;
        (pSVar37->m_id).Data2 = uVar29;
        (pSVar37->m_id).Data3 = uVar30;
        *(undefined8 *)(pSVar37->m_id).Data4 = uVar3;
      }
      pSVar41 = pSVar38;
      pSVar42 = pSVar37;
      if (pSVar37->m_sn < pSVar40->m_sn) {
        aVar2 = (pSVar40->m_value).m_u;
        uVar28 = (pSVar40->m_id).Data1;
        uVar29 = (pSVar40->m_id).Data2;
        uVar30 = (pSVar40->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar40->m_id).Data4;
        OVar31 = pSVar40->m_sn;
        OVar23 = pSVar40->m_sn_active;
        OVar24 = pSVar40->m_id_active;
        OVar25 = pSVar40->m_reserved1;
        OVar26 = pSVar40->m_reserved2;
        OVar27 = pSVar40->m_id_crc32;
        pSVar35 = pSVar40->m_next;
        OVar21 = (pSVar40->m_value).m_u_type;
        OVar22 = (pSVar40->m_value).m_u32;
        (pSVar40->m_value).m_u = (pSVar37->m_value).m_u;
        uVar1 = (pSVar37->m_id).Data1;
        uVar19 = (pSVar37->m_id).Data2;
        uVar20 = (pSVar37->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar37->m_id).Data4;
        OVar5 = pSVar37->m_sn;
        OVar14 = pSVar37->m_sn_active;
        OVar15 = pSVar37->m_id_active;
        OVar16 = pSVar37->m_reserved1;
        OVar17 = pSVar37->m_reserved2;
        OVar18 = pSVar37->m_id_crc32;
        OVar12 = (pSVar37->m_value).m_u_type;
        OVar13 = (pSVar37->m_value).m_u32;
        pSVar40->m_next = pSVar37->m_next;
        (pSVar40->m_value).m_u_type = OVar12;
        (pSVar40->m_value).m_u32 = OVar13;
        pSVar40->m_sn = OVar5;
        pSVar40->m_sn_active = OVar14;
        pSVar40->m_id_active = OVar15;
        pSVar40->m_reserved1 = OVar16;
        pSVar40->m_reserved2 = OVar17;
        pSVar40->m_id_crc32 = OVar18;
        (pSVar40->m_id).Data1 = uVar1;
        (pSVar40->m_id).Data2 = uVar19;
        (pSVar40->m_id).Data3 = uVar20;
        *(undefined8 *)(pSVar40->m_id).Data4 = uVar4;
        (pSVar37->m_value).m_u = aVar2;
        pSVar37->m_next = pSVar35;
        (pSVar37->m_value).m_u_type = OVar21;
        (pSVar37->m_value).m_u32 = OVar22;
        pSVar37->m_sn = OVar31;
        pSVar37->m_sn_active = OVar23;
        pSVar37->m_id_active = OVar24;
        pSVar37->m_reserved1 = OVar25;
        pSVar37->m_reserved2 = OVar26;
        pSVar37->m_id_crc32 = OVar27;
        (pSVar37->m_id).Data1 = uVar28;
        (pSVar37->m_id).Data2 = uVar29;
        (pSVar37->m_id).Data3 = uVar30;
        *(undefined8 *)(pSVar37->m_id).Data4 = uVar3;
      }
LAB_004d4b4e:
      pSVar35 = pSVar41;
      if (pSVar41 < pSVar40) {
        do {
          pSVar41 = pSVar35 + 1;
          if (pSVar40 <= pSVar41) break;
          pSVar36 = pSVar35 + 1;
          pSVar35 = pSVar41;
        } while (pSVar36->m_sn <= pSVar40->m_sn);
      }
      pSVar35 = pSVar41;
      if (pSVar40 <= pSVar41) {
        do {
          pSVar35 = pSVar41 + 1;
          if (pSVar37 < pSVar35) break;
          pSVar36 = pSVar41 + 1;
          pSVar41 = pSVar35;
        } while (pSVar36->m_sn <= pSVar40->m_sn);
      }
      do {
        pSVar41 = pSVar35;
        pSVar36 = pSVar42;
        pSVar42 = pSVar36 + -1;
        if (pSVar42 <= pSVar40) break;
        pSVar35 = pSVar41;
      } while (pSVar40->m_sn < *(ulong *)((long)(pSVar36 + -1) + 0x10));
      if (pSVar41 <= pSVar42) {
        aVar2 = (pSVar41->m_value).m_u;
        uVar28 = (pSVar41->m_id).Data1;
        uVar29 = (pSVar41->m_id).Data2;
        uVar30 = (pSVar41->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar41->m_id).Data4;
        OVar31 = pSVar41->m_sn;
        uVar4 = *(undefined8 *)&pSVar41->m_sn_active;
        pSVar35 = pSVar41->m_next;
        uVar6 = *(undefined8 *)&pSVar41->m_value;
        (pSVar41->m_value).m_u = *(anon_union_8_5_72d3814f_for_m_u *)((long)(pSVar36 + -1) + 0x30);
        uVar1 = (pSVar42->m_id).Data1;
        uVar19 = (pSVar42->m_id).Data2;
        uVar20 = (pSVar42->m_id).Data3;
        uVar7 = *(undefined8 *)((long)(pSVar36 + -1) + 8);
        OVar5 = *(ON__UINT64 *)((long)(pSVar36 + -1) + 0x10);
        uVar8 = *(undefined8 *)((long)(pSVar36 + -1) + 0x18);
        uVar9 = *(undefined8 *)((long)(pSVar36 + -1) + 0x28);
        pSVar41->m_next = *(SN_ELEMENT **)((long)(pSVar36 + -1) + 0x20);
        (pSVar41->m_value).m_u_type = (int)uVar9;
        (pSVar41->m_value).m_u32 = (int)((ulong)uVar9 >> 0x20);
        pSVar41->m_sn = OVar5;
        pSVar41->m_sn_active = (char)uVar8;
        pSVar41->m_id_active = (char)((ulong)uVar8 >> 8);
        pSVar41->m_reserved1 = (char)((ulong)uVar8 >> 0x10);
        pSVar41->m_reserved2 = (char)((ulong)uVar8 >> 0x18);
        pSVar41->m_id_crc32 = (int)((ulong)uVar8 >> 0x20);
        (pSVar41->m_id).Data1 = uVar1;
        (pSVar41->m_id).Data2 = uVar19;
        (pSVar41->m_id).Data3 = uVar20;
        *(undefined8 *)(pSVar41->m_id).Data4 = uVar7;
        *(anon_union_8_5_72d3814f_for_m_u *)((long)(pSVar36 + -1) + 0x30) = aVar2;
        *(SN_ELEMENT **)((long)(pSVar36 + -1) + 0x20) = pSVar35;
        *(undefined8 *)((long)(pSVar36 + -1) + 0x28) = uVar6;
        *(ON__UINT64 *)((long)(pSVar36 + -1) + 0x10) = OVar31;
        *(undefined8 *)((long)(pSVar36 + -1) + 0x18) = uVar4;
        (pSVar42->m_id).Data1 = uVar28;
        (pSVar42->m_id).Data2 = uVar29;
        (pSVar42->m_id).Data3 = uVar30;
        *(undefined8 *)((long)(pSVar36 + -1) + 8) = uVar3;
        if (pSVar42 == pSVar40) {
          pSVar40 = pSVar41;
        }
        goto LAB_004d4b4e;
      }
      if (pSVar40 < pSVar36) {
        do {
          pSVar36 = pSVar42;
          if (pSVar36 <= pSVar40) break;
          pSVar42 = pSVar36 + -1;
        } while (pSVar36->m_sn == pSVar40->m_sn);
      }
      pSVar42 = pSVar36;
      if (pSVar36 <= pSVar40) {
        do {
          pSVar36 = pSVar42 + -1;
          if (pSVar36 <= pSVar38) break;
          puVar10 = (undefined1 *)(pSVar42 + -1);
          pSVar42 = pSVar36;
        } while (*(ON__UINT64 *)(puVar10 + 0x10) == pSVar40->m_sn);
      }
      if ((long)pSVar36 - (long)pSVar38 < (long)pSVar37 - (long)pSVar41) goto LAB_004d4d5d;
      if (pSVar38 < pSVar36) {
        auStack_208[iVar32] = pSVar38;
        local_3f8[iVar32] = (ulong)pSVar36;
        uVar33 = (ulong)(iVar32 + 1);
      }
      iVar32 = (int)uVar33;
      pSVar38 = pSVar41;
      if (pSVar37 <= pSVar41) goto LAB_004d4d7f;
    }
    for (; pSVar41 = pSVar38, pSVar40 = pSVar38, pSVar38 < pSVar37;
        pSVar37 = (SN_ELEMENT *)((long)pSVar37 + 0xffffffffffffffc8)) {
      while (pSVar42 = pSVar41, pSVar40 = pSVar40 + 1, pSVar40 <= pSVar37) {
        pSVar41 = pSVar40;
        if (pSVar40->m_sn <= pSVar42->m_sn) {
          pSVar41 = pSVar42;
        }
      }
      aVar2 = (pSVar42->m_value).m_u;
      uVar3 = *(undefined8 *)&pSVar42->m_id;
      uVar4 = *(undefined8 *)(pSVar42->m_id).Data4;
      OVar31 = pSVar42->m_sn;
      uVar6 = *(undefined8 *)&pSVar42->m_sn_active;
      pSVar40 = pSVar42->m_next;
      OVar18 = (pSVar42->m_value).m_u_type;
      OVar21 = (pSVar42->m_value).m_u32;
      (pSVar42->m_value).m_u = *(anon_union_8_5_72d3814f_for_m_u *)((long)pSVar37 + 0x30);
      uVar7 = *(undefined8 *)pSVar37;
      uVar8 = *(undefined8 *)((long)pSVar37 + 8);
      OVar5 = *(ON__UINT64 *)((long)pSVar37 + 0x10);
      uVar9 = *(undefined8 *)((long)pSVar37 + 0x18);
      OVar12 = ((MAP_VALUE *)((long)pSVar37 + 0x28))->m_u_type;
      OVar13 = ((MAP_VALUE *)((long)pSVar37 + 0x28))->m_u32;
      pSVar42->m_next = *(SN_ELEMENT **)((long)pSVar37 + 0x20);
      (pSVar42->m_value).m_u_type = OVar12;
      (pSVar42->m_value).m_u32 = OVar13;
      pSVar42->m_sn = OVar5;
      *(undefined8 *)&pSVar42->m_sn_active = uVar9;
      (pSVar42->m_id).Data1 = (int)uVar7;
      (pSVar42->m_id).Data2 = (short)((ulong)uVar7 >> 0x20);
      (pSVar42->m_id).Data3 = (short)((ulong)uVar7 >> 0x30);
      *(undefined8 *)(pSVar42->m_id).Data4 = uVar8;
      *(anon_union_8_5_72d3814f_for_m_u *)((long)pSVar37 + 0x30) = aVar2;
      *(SN_ELEMENT **)((long)pSVar37 + 0x20) = pSVar40;
      ((MAP_VALUE *)((long)pSVar37 + 0x28))->m_u_type = OVar18;
      ((MAP_VALUE *)((long)pSVar37 + 0x28))->m_u32 = OVar21;
      *(ON__UINT64 *)((long)pSVar37 + 0x10) = OVar31;
      *(undefined8 *)((long)pSVar37 + 0x18) = uVar6;
      *(undefined8 *)pSVar37 = uVar3;
      pOVar11 = (ON_UUID *)((long)pSVar37 + 8);
      pOVar11->Data1 = (int)uVar4;
      pOVar11->Data2 = (short)((ulong)uVar4 >> 0x20);
      pOVar11->Data3 = (short)((ulong)uVar4 >> 0x30);
    }
    goto LAB_004d4d7f;
  }
  if (uVar1 == 1) {
    OVar31 = this->m_sn[0].m_sn;
  }
  else {
    OVar31 = 0;
  }
  this->m_sn1 = OVar31;
  lVar34 = 0x10;
LAB_004d4dd2:
  *(ON__UINT64 *)((long)(&this->m_sn[0].m_id + -2) + lVar34) = OVar31;
  this->m_sorted = 1;
  return;
LAB_004d4d5d:
  if (pSVar41 < pSVar37) {
    auStack_208[iVar32] = pSVar41;
    local_3f8[iVar32] = (ulong)pSVar37;
    uVar33 = (ulong)(iVar32 + 1);
  }
  iVar32 = (int)uVar33;
  pSVar37 = pSVar36;
  if (pSVar38 < pSVar36) goto LAB_004d49bf;
LAB_004d4d7f:
  if (0 < iVar32) {
    uVar33 = (ulong)(iVar32 - 1);
    pSVar38 = (SN_ELEMENT *)auStack_208[uVar33];
    pSVar37 = (SN_ELEMENT *)local_3f8[uVar33];
    goto LAB_004d49bf;
  }
  this->m_sn0 = this->m_sn[0].m_sn;
  OVar31 = this->m_sn[this->m_count - 1].m_sn;
  lVar34 = 0x18;
  goto LAB_004d4dd2;
}

Assistant:

void ON_SN_BLOCK::SortBlockHelper()
{
  // Sort m_sn[] by serial number.
  //
  // This is a high speed helper function.  
  //
  // The calling function verify:
  //   m_sorted is zero
  //   m_purged is zero
  //   m_count > 0
  //
  // The array m_sn[] is almost always nearly sorted,
  // so the sort used here should efficiently
  // handle almost sorted arrays. In the past,
  // heap sort was the best choice, but the qsort()
  // in VS 2010 is now a better choice than heap sort.
   
  if ( m_count > 1 )
  {
#if 1
    // Quick sort
    ON_qsort_SN_ELEMENT(m_sn, (size_t)m_count);
#else
    // Heap sort
    size_t i, j, k, i_end;
    struct SN_ELEMENT e_tmp;
    struct SN_ELEMENT* e;

    e = m_sn;

    k = m_count >> 1;
    i_end = m_count-1;
    for (;;) 
    {
      if (k)
      {
        --k;
        e_tmp = e[k];
      } 
      else 
      {
        e_tmp = e[i_end];
        e[i_end] = e[0];
        if (!(--i_end)) 
        {
          e[0] = e_tmp;
          break;
        }
      }

      i = k;
      j = (k<<1) + 1;
      while (j <= i_end)
      {
        if (j < i_end && e[j].m_sn < e[j + 1].m_sn)
          j++;
        if (e_tmp.m_sn < e[j].m_sn)
        {
          e[i] = e[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
          j = i_end + 1;
      }
      e[i] = e_tmp;
    }
#endif
    m_sn0 = m_sn[0].m_sn;
    m_sn1 = m_sn[m_count-1].m_sn;
  }
  else
  {
    m_sn0 = m_sn1 = ((1 == m_count) ? m_sn[0].m_sn : 0);
  }
  m_sorted = 1;
}